

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<int> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::getFd(PromiseClient *this)

{
  ClientHook *pCVar1;
  long in_RSI;
  PromiseClient *this_local;
  
  if ((*(byte *)(in_RSI + 0x69) & 1) == 0) {
    kj::Maybe<int>::Maybe((Maybe<int> *)this);
  }
  else {
    pCVar1 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
                       ((Own<capnp::ClientHook,_std::nullptr_t> *)(in_RSI + 0x40));
    (*pCVar1->_vptr_ClientHook[5])(this);
  }
  return (Maybe<int>)(NullableValue<int>)this;
}

Assistant:

kj::Maybe<int> getFd() override {
      if (isResolved) {
        return cap->getFd();
      } else {
        // In theory, before resolution, the ImportClient for the promise could have an FD
        // attached, if the promise itself was presented with an attached FD. However, we can't
        // really return that one here because it may be closed when we get the Resolve message
        // later. In theory we could have the PromiseClient itself take ownership of an FD that
        // arrived attached to a promise cap, but the use case for that is questionable. I'm
        // keeping it simple for now.
        return kj::none;
      }
    }